

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

void __thiscall
t_rs_generator::render_const_value
          (t_rs_generator *this,t_type *ttype,t_const_value *tvalue,bool is_owned)

{
  uint uVar1;
  t_base tVar2;
  ulong uVar3;
  t_type *ttype_00;
  int64_t iVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  t_base tbase;
  char *pcVar8;
  double dVar9;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  undefined1 local_c1;
  string local_c0;
  string local_a0;
  string local_80;
  string local_50;
  t_const_value *local_30;
  t_base_type *tbase_type;
  t_const_value *ptStack_20;
  bool is_owned_local;
  t_const_value *tvalue_local;
  t_type *ttype_local;
  t_rs_generator *this_local;
  
  tbase_type._7_1_ = is_owned;
  ptStack_20 = tvalue;
  tvalue_local = (t_const_value *)ttype;
  ttype_local = (t_type *)this;
  uVar1 = (*(ttype->super_t_doc)._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    uVar3 = (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x48))();
    if ((uVar3 & 1) == 0) {
      uVar3 = (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x50))();
      if ((uVar3 & 1) == 0) {
        uVar3 = (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x58))();
        if (((uVar3 & 1) == 0) &&
           (uVar3 = (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x60))(),
           (uVar3 & 1) == 0)) {
          uVar3 = (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x68))();
          if ((uVar3 & 1) == 0) {
            pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     __cxa_allocate_exception(0x20);
            pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x18))();
            std::operator+(pbVar6,"cannot generate const value for ",pbVar7);
            __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
          }
          t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
          poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_168);
          poVar5 = std::operator<<(poVar5,"{");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_168);
          t_generator::indent_up(&this->super_t_generator);
          uVar3 = (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x70))();
          if ((uVar3 & 1) == 0) {
            uVar3 = (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x78))();
            if ((uVar3 & 1) == 0) {
              uVar3 = (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x80))();
              if ((uVar3 & 1) == 0) {
                pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         __cxa_allocate_exception(0x20);
                pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (**(code **)(*(long *)&(tvalue_local->mapVal_)._M_t._M_impl + 0x18))();
                std::operator+(pbVar6,"cannot generate const container value for ",pbVar7);
                __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
              }
              render_const_map(this,(t_type *)tvalue_local,ptStack_20);
            }
            else {
              render_const_set(this,(t_type *)tvalue_local,ptStack_20);
            }
          }
          else {
            render_const_list(this,(t_type *)tvalue_local,ptStack_20);
          }
          t_generator::indent_down(&this->super_t_generator);
          t_generator::indent_abi_cxx11_(&local_188,&this->super_t_generator);
          poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_188);
          poVar5 = std::operator<<(poVar5,"}");
          std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_188);
        }
        else {
          render_const_struct(this,(t_type *)tvalue_local,ptStack_20);
        }
      }
      else {
        t_generator::indent_abi_cxx11_(&local_e8,&this->super_t_generator);
        poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_e8);
        poVar5 = std::operator<<(poVar5,"{");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_e8);
        t_generator::indent_up(&this->super_t_generator);
        t_generator::indent_abi_cxx11_(&local_108,&this->super_t_generator);
        poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_108);
        to_rust_type_abi_cxx11_(&local_128,this,(t_type *)tvalue_local);
        poVar5 = std::operator<<(poVar5,(string *)&local_128);
        poVar5 = std::operator<<(poVar5,"::try_from(");
        iVar4 = t_const_value::get_integer(ptStack_20);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar4);
        poVar5 = std::operator<<(poVar5,").expect(\"expecting valid const value\")");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_128);
        std::__cxx11::string::~string((string *)&local_108);
        t_generator::indent_down(&this->super_t_generator);
        t_generator::indent_abi_cxx11_(&local_148,&this->super_t_generator);
        poVar5 = std::operator<<((ostream *)&this->f_gen_,(string *)&local_148);
        poVar5 = std::operator<<(poVar5,"}");
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_148);
      }
    }
    else {
      ttype_00 = t_generator::get_true_type((t_type *)tvalue_local);
      render_const_value(this,ttype_00,ptStack_20,true);
    }
  }
  else {
    local_30 = tvalue_local;
    tVar2 = t_base_type::get_base((t_base_type *)tvalue_local);
    switch(tVar2) {
    case TYPE_STRING:
      uVar1 = (*(((t_type *)&local_30->mapVal_)->super_t_doc)._vptr_t_doc[7])();
      if ((uVar1 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&this->f_gen_,"\"");
        t_const_value::get_string_abi_cxx11_(&local_a0,ptStack_20);
        poVar5 = std::operator<<(poVar5,(string *)&local_a0);
        std::operator<<(poVar5,"\"");
        std::__cxx11::string::~string((string *)&local_a0);
        if ((tbase_type._7_1_ & 1) != 0) {
          std::operator<<((ostream *)&this->f_gen_,".to_owned()");
        }
      }
      else if ((tbase_type._7_1_ & 1) == 0) {
        poVar5 = std::operator<<((ostream *)&this->f_gen_,"b\"");
        t_const_value::get_string_abi_cxx11_(&local_80,ptStack_20);
        poVar5 = std::operator<<(poVar5,(string *)&local_80);
        std::operator<<(poVar5,"\"");
        std::__cxx11::string::~string((string *)&local_80);
      }
      else {
        poVar5 = std::operator<<((ostream *)&this->f_gen_,"\"");
        t_const_value::get_string_abi_cxx11_(&local_50,ptStack_20);
        poVar5 = std::operator<<(poVar5,(string *)&local_50);
        poVar5 = std::operator<<(poVar5,"\"");
        std::operator<<(poVar5,".to_owned().into_bytes()");
        std::__cxx11::string::~string((string *)&local_50);
      }
      break;
    case TYPE_BOOL:
      iVar4 = t_const_value::get_integer(ptStack_20);
      pcVar8 = "false";
      if (iVar4 != 0) {
        pcVar8 = "true";
      }
      std::operator<<((ostream *)&this->f_gen_,pcVar8);
      break;
    case TYPE_I8:
    case TYPE_I16:
    case TYPE_I32:
    case TYPE_I64:
      iVar4 = t_const_value::get_integer(ptStack_20);
      std::ostream::operator<<(&this->f_gen_,iVar4);
      break;
    case TYPE_DOUBLE:
      poVar5 = std::operator<<((ostream *)&this->f_gen_,"OrderedFloat::from(");
      dVar9 = t_const_value::get_double(ptStack_20);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,dVar9);
      std::operator<<(poVar5,"_f64)");
      break;
    default:
      local_c1 = 1;
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __cxa_allocate_exception(0x20);
      tVar2 = t_base_type::get_base((t_base_type *)local_30);
      t_base_type::t_base_name_abi_cxx11_(&local_c0,(t_base_type *)(ulong)tVar2,tbase);
      std::operator+(pbVar6,"cannot generate const value for ",&local_c0);
      local_c1 = 0;
      __cxa_throw(pbVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
    }
  }
  return;
}

Assistant:

void t_rs_generator::render_const_value(t_type* ttype, t_const_value* tvalue, bool is_owned) {
  if (ttype->is_base_type()) {
    t_base_type* tbase_type = (t_base_type*)ttype;
    switch (tbase_type->get_base()) {
    case t_base_type::TYPE_STRING:
      if (tbase_type->is_binary()) {
        if (is_owned) {
          f_gen_ << "\"" << tvalue->get_string() << "\""<<  ".to_owned().into_bytes()";
        } else {
          f_gen_ << "b\"" << tvalue->get_string() << "\"";
        }
      } else {
        f_gen_ << "\"" << tvalue->get_string() << "\"";
        if (is_owned) {
          f_gen_ << ".to_owned()";
        }
      }
      break;
    case t_base_type::TYPE_BOOL:
      f_gen_ << (tvalue->get_integer() ? "true" : "false");
      break;
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
      f_gen_ << tvalue->get_integer();
      break;
    case t_base_type::TYPE_DOUBLE:
      f_gen_ << "OrderedFloat::from(" << tvalue->get_double() << "_f64)";
      break;
    default:
      throw "cannot generate const value for " + t_base_type::t_base_name(tbase_type->get_base());
    }
  } else if (ttype->is_typedef()) {
    render_const_value(get_true_type(ttype), tvalue);
  } else if (ttype->is_enum()) {
    f_gen_ << indent() << "{" << endl;
    indent_up();
    f_gen_
      << indent()
      << to_rust_type(ttype)
      << "::try_from("
      << tvalue->get_integer()
      << ").expect(\"expecting valid const value\")"
      << endl;
    indent_down();
    f_gen_ << indent() << "}" << endl;
  } else if (ttype->is_struct() || ttype->is_xception()) {
    render_const_struct(ttype, tvalue);
  } else if (ttype->is_container()) {
    f_gen_ << indent() << "{" << endl;
    indent_up();

    if (ttype->is_list()) {
      render_const_list(ttype, tvalue);
    } else if (ttype->is_set()) {
      render_const_set(ttype, tvalue);
    } else if (ttype->is_map()) {
      render_const_map(ttype, tvalue);
    } else {
      throw "cannot generate const container value for " + ttype->get_name();
    }

    indent_down();
    f_gen_ << indent() << "}" << endl;
  } else {
    throw "cannot generate const value for " + ttype->get_name();
  }
}